

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfutureinterface.cpp
# Opt level: O3

void __thiscall
QFutureInterfaceBasePrivate::QFutureInterfaceBasePrivate
          (QFutureInterfaceBasePrivate *this,State initialState)

{
  (this->outputConnections).d.d = (Data *)0x0;
  (this->outputConnections).d.ptr = (QFutureCallOutInterface **)0x0;
  (this->m_mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p = (__pointer_type)0x0;
  (this->continuationMutex).d_ptr._q_value._M_b._M_p = (__pointer_type)0x0;
  (this->outputConnections).d.size = 0;
  (this->progressTime).t1 = -0x8000000000000000;
  (this->progressTime).t2 = -0x8000000000000000;
  QWaitCondition::QWaitCondition(&this->waitCondition);
  QWaitCondition::QWaitCondition(&this->pausedWaitCondition);
  QtPrivate::ResultStoreBase::ResultStoreBase(&(this->data).m_results);
  this->continuationData = (QFutureInterfaceBasePrivate *)0x0;
  this->nonConcludedParent = (QFutureInterfaceBasePrivate *)0x0;
  (this->continuation).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->continuation)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->continuation).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->continuation).super__Function_base._M_functor + 8) = 0;
  this->runnable = (QRunnable *)0x0;
  this->m_pool = (QThreadPool *)0x0;
  (this->refCount).m_refCount = (QAtomicInteger<int>)0x1;
  (this->refCount).m_refCountT = (QAtomicInteger<int>)0x0;
  (this->state).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i = initialState;
  *(undefined8 *)&this->m_progressValue = 0;
  *(undefined8 *)((long)&(this->m_progress).d + 4) = 0;
  *(undefined8 *)((long)&this->m_expectedResultCount + 2) = 0;
  QElapsedTimer::invalidate(&this->progressTime);
  return;
}

Assistant:

QFutureInterfaceBasePrivate::QFutureInterfaceBasePrivate(QFutureInterfaceBase::State initialState)
    : state(initialState)
{
    progressTime.invalidate();
}